

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSetMaxContentLength(size_t contentLength)

{
  size_t sVar1;
  int local_14;
  int errCode;
  size_t contentLength_local;
  
  local_14 = 0;
  sVar1 = contentLength;
  if (UpnpSdkInit != 1) {
    local_14 = -0x74;
    sVar1 = g_maxContentLength;
  }
  g_maxContentLength = sVar1;
  return local_14;
}

Assistant:

int UpnpSetMaxContentLength(size_t contentLength)
{
	int errCode = UPNP_E_SUCCESS;

	do {
		if (UpnpSdkInit != 1) {
			errCode = UPNP_E_FINISH;
			break;
		}
		g_maxContentLength = contentLength;
	} while (0);

	return errCode;
}